

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

size_t __thiscall TcpSocketImpl::Write(TcpSocketImpl *this,void *buf,size_t len)

{
  __array _Var1;
  bool bVar2;
  int iVar3;
  type puVar4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_58;
  __array tmp_1;
  int iRet;
  lock_guard<std::mutex> lock;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_30;
  __array tmp;
  size_t len_local;
  void *buf_local;
  TcpSocketImpl *this_local;
  
  if ((((((this->super_BaseSocketImpl).m_bStop & 1U) == 1) || ((this->m_bCloseReq & 1U) == 1)) ||
      (buf == (void *)0x0)) || (len == 0)) {
    this_local = (TcpSocketImpl *)0x0;
  }
  else {
    tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)len;
    bVar2 = std::operator!=(&BaseSocketImpl::s_fTrafficDebug,(nullptr_t)0x0);
    if (bVar2) {
      std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator()
                (&BaseSocketImpl::s_fTrafficDebug,
                 (unsigned_short)(this->super_BaseSocketImpl).m_fSock,(char *)buf,
                 (unsigned_long)
                 tmp._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,true);
    }
    bVar2 = std::operator!=(&this->m_fnSslInitDone,(nullptr_t)0x0);
    if ((bVar2) && (iVar3 = std::function<int_()>::operator()(&this->m_fnSslInitDone), iVar3 != 1))
    {
      std::make_unique<unsigned_char[]>((size_t)&local_30);
      _Var1 = tmp;
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         (&local_30,0);
      std::copy_n<unsigned_char_const*,unsigned_long,unsigned_char*>
                ((uchar *)buf,
                 (unsigned_long)
                 _Var1._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,puVar4);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&stack0xffffffffffffffb8,&this->m_mxOutDeque);
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
      ::
      emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&this->m_quTmpOutData,&local_30,(unsigned_long *)&tmp);
      this_local = (TcpSocketImpl *)
                   tmp._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffb8);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&local_30);
    }
    else {
      tmp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 0;
      bVar2 = std::operator==(&this->m_fnSslEncode,(nullptr_t)0x0);
      if ((bVar2) ||
         (tmp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ =
               std::function<int_(const_unsigned_char_*,_unsigned_long)>::operator()
                         (&this->m_fnSslEncode,(uchar *)buf,
                          (unsigned_long)
                          tmp._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl),
         tmp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
         .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ == 0)) {
        std::make_unique<unsigned_char[]>((size_t)&local_58);
        _Var1 = tmp;
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&local_58,0);
        std::copy_n<unsigned_char_const*,unsigned_long,unsigned_char*>
                  ((uchar *)buf,
                   (unsigned_long)
                   _Var1._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,puVar4);
        std::mutex::lock(&this->m_mxOutDeque);
        std::__atomic_base<unsigned_long>::operator+=
                  (&(this->m_atOutBytes).super___atomic_base<unsigned_long>,
                   (__int_type)
                   tmp._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&this->m_quOutData,&local_58,(unsigned_long *)&tmp);
        std::mutex::unlock(&this->m_mxOutDeque);
        tmp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 1;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  (&local_58);
      }
      if (0 < tmp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
              ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_) {
        TriggerWriteThread(this);
      }
      this_local = (TcpSocketImpl *)
                   tmp._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t TcpSocketImpl::Write(const void* buf, size_t len)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0)
        return 0;

    if (s_fTrafficDebug != nullptr)
        s_fTrafficDebug(static_cast<uint16_t>(m_fSock), static_cast<const char*>(buf), len, true);

    if (m_fnSslInitDone != nullptr && m_fnSslInitDone() != 1)
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        lock_guard<mutex> lock(m_mxOutDeque);
        m_quTmpOutData.emplace_back(move(tmp), len);
        return len;
    }

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}